

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

bool __thiscall
BuildLog::RecordCommand(BuildLog *this,Edge *edge,int start_time,int end_time,TimeStamp mtime)

{
  pointer ppNVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  LogEntry *entry;
  size_t extraout_RDX;
  BuildLog *this_00;
  __hashtable *__h;
  pointer ppNVar6;
  StringPiece command_00;
  key_type local_78;
  LogEntry *local_68;
  uint64_t local_60;
  TimeStamp local_58;
  string command;
  
  local_58 = mtime;
  Edge::EvaluateCommand_abi_cxx11_(&command,edge,true);
  command_00.len_ = extraout_RDX;
  command_00.str_ = (char *)command._M_string_length;
  local_60 = LogEntry::HashCommand((LogEntry *)command._M_dataplus._M_p,command_00);
  for (ppNVar6 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppNVar1 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish, ppNVar6 != ppNVar1; ppNVar6 = ppNVar6 + 1) {
    pNVar2 = *ppNVar6;
    local_78.str_ = (pNVar2->path_)._M_dataplus._M_p;
    local_78.len_ = (pNVar2->path_)._M_string_length;
    iVar5 = std::
            _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,&local_78);
    if (iVar5.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>.
        _M_cur == (__node_type *)0x0) {
      entry = (LogEntry *)operator_new(0x38);
      std::__cxx11::string::string((string *)entry,(string *)pNVar2);
      local_78.str_ = (entry->output)._M_dataplus._M_p;
      local_78.len_ = (entry->output)._M_string_length;
      local_68 = entry;
      std::
      _Hashtable<StringPiece,std::pair<StringPiece_const,BuildLog::LogEntry*>,std::allocator<std::pair<StringPiece_const,BuildLog::LogEntry*>>,std::__detail::_Select1st,std::equal_to<StringPiece>,std::hash<StringPiece>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<StringPiece_const,BuildLog::LogEntry*>>
                ((_Hashtable<StringPiece,std::pair<StringPiece_const,BuildLog::LogEntry*>,std::allocator<std::pair<StringPiece_const,BuildLog::LogEntry*>>,std::__detail::_Select1st,std::equal_to<StringPiece>,std::hash<StringPiece>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this,&local_78);
    }
    else {
      entry = *(LogEntry **)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                      ._M_cur + 0x18);
    }
    entry->command_hash = local_60;
    entry->start_time = start_time;
    entry->end_time = end_time;
    entry->mtime = local_58;
    this_00 = this;
    bVar3 = OpenForWriteIfNeeded(this);
    if (!bVar3) break;
    if (this->log_file_ != (FILE *)0x0) {
      bVar3 = WriteEntry(this_00,this->log_file_,entry);
      if (!bVar3) break;
      iVar4 = fflush((FILE *)this->log_file_);
      if (iVar4 != 0) break;
    }
  }
  std::__cxx11::string::~string((string *)&command);
  return ppNVar6 == ppNVar1;
}

Assistant:

bool BuildLog::RecordCommand(Edge* edge, int start_time, int end_time,
                             TimeStamp mtime) {
  string command = edge->EvaluateCommand(true);
  uint64_t command_hash = LogEntry::HashCommand(command);
  for (vector<Node*>::iterator out = edge->outputs_.begin();
       out != edge->outputs_.end(); ++out) {
    const string& path = (*out)->path();
    Entries::iterator i = entries_.find(path);
    LogEntry* log_entry;
    if (i != entries_.end()) {
      log_entry = i->second;
    } else {
      log_entry = new LogEntry(path);
      entries_.insert(Entries::value_type(log_entry->output, log_entry));
    }
    log_entry->command_hash = command_hash;
    log_entry->start_time = start_time;
    log_entry->end_time = end_time;
    log_entry->mtime = mtime;

    if (!OpenForWriteIfNeeded()) {
      return false;
    }
    if (log_file_) {
      if (!WriteEntry(log_file_, *log_entry))
        return false;
      if (fflush(log_file_) != 0) {
          return false;
      }
    }
  }
  return true;
}